

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
emplace_back<slang::ast::Expression_const&>
          (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *this,Expression *args)

{
  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *in_RDI;
  Expression *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *in_stack_00000030;
  Expression *in_stack_ffffffffffffffd8;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::Expression_const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    end(in_RDI);
    slang::ast::SystemTimingCheckSymbol::Arg::Arg((Arg *)in_RDI,in_stack_ffffffffffffffd8);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }